

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

InterfaceType libcellml::interfaceTypeFor(PublicPrivateRequiredPair *pair)

{
  InterfaceType local_14;
  InterfaceType interfaceType;
  PublicPrivateRequiredPair *pair_local;
  
  if (((pair->first & 1U) == 0) || ((pair->second & 1U) == 0)) {
    if ((pair->first & 1U) == 0) {
      local_14 = (InterfaceType)((pair->second & 1U) != 0);
    }
    else {
      local_14 = PUBLIC;
    }
  }
  else {
    local_14 = PUBLIC_AND_PRIVATE;
  }
  return local_14;
}

Assistant:

Variable::InterfaceType interfaceTypeFor(const PublicPrivateRequiredPair &pair)
{
    Variable::InterfaceType interfaceType = Variable::InterfaceType::NONE;
    if (pair.first && pair.second) {
        interfaceType = Variable::InterfaceType::PUBLIC_AND_PRIVATE;
    } else if (pair.first) {
        interfaceType = Variable::InterfaceType::PUBLIC;
    } else if (pair.second) {
        interfaceType = Variable::InterfaceType::PRIVATE;
    }

    return interfaceType;
}